

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalstmt.c
# Opt level: O3

void stmt_eval(astnode *ptr)

{
  int iVar1;
  long lVar2;
  
  if (ptr != (astnode *)0x0) {
    do {
      iVar1 = ptr->type;
      if (iVar1 == 0x140) {
        stmt_eval((astnode *)ptr->left);
        lVar2 = 0x10;
      }
      else {
        lVar2 = 8;
        if (iVar1 != 0x141) {
          if (iVar1 != 0x125) {
            yyerror("Warning: Unknown statement type");
            return;
          }
          expr_eval((astnode *)ptr->left);
          return;
        }
      }
      ptr = *(astnode **)((long)&ptr->type + lVar2);
    } while (ptr != (astnode *)0x0);
  }
  return;
}

Assistant:

void stmt_eval(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		
		case COMPOUND:
			//Enter frame
			stmt_eval(ptr->left);
			//Leave frame
			break;
			
		case STATEMENT:
			stmt_eval(ptr->left);
			stmt_eval(ptr->right);
			//Left is current statement
			//Right is next statement
			break;
			
		case RETURN:
			expr_eval(ptr->left);
			//Return assembly
			break;
		
		default:
			yyerror("Warning: Unknown statement type");
			break;
		
	}
	
	return;
	
}